

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::RobustnessTestCase
          (RobustnessTestCase *this,EglTestContext *eglTestCtx,char *name,char *description)

{
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  RobustnessTestCase *this_local;
  
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_0327a548;
  Params::Params(&this->m_params);
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglConfig = (EGLConfig)0x0;
  this->m_eglSurface = (EGLSurface)0x0;
  this->m_window = (NativeWindow *)0x0;
  glu::ContextType::ContextType(&this->m_glContextType);
  return;
}

Assistant:

RobustnessTestCase::RobustnessTestCase (EglTestContext& eglTestCtx, const char* name, const char* description)
	: TestCase			(eglTestCtx, name, description)
	, m_eglDisplay		(EGL_NO_DISPLAY)
	, m_eglConfig		(0)
	, m_eglSurface		(EGL_NO_SURFACE)
	, m_window			(DE_NULL)
{
}